

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,BrotliEncoderParams *params,
               ContextType literal_context_mode,Command_conflict *commands,size_t n_commands,
               MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  HuffmanTree *tree;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  size_t context;
  size_t i;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  HistogramLiteral *histogram;
  HistogramCommand *histogram_00;
  HistogramDistance *histogram_01;
  bool bVar19;
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;
  
  uVar7 = (params->dist).alphabet_size;
  uVar16 = 0x220;
  if (uVar7 < 0x220) {
    uVar16 = uVar7;
  }
  if (params->large_window == 0) {
    uVar16 = uVar7;
  }
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  literal_enc.block_types_ = (mb->literal_split).types;
  literal_enc.block_lengths_ = (mb->literal_split).lengths;
  literal_enc.num_block_types_ = (mb->literal_split).num_types;
  literal_enc.num_blocks_ = (mb->literal_split).num_blocks;
  literal_enc.histogram_length_ = 0x100;
  literal_enc.block_split_code_.type_code_calculator.last_type = 1;
  literal_enc.block_split_code_.type_code_calculator.second_last_type = 0;
  literal_enc.block_ix_ = 0;
  if (literal_enc.num_blocks_ == 0) {
    literal_enc.block_len_ = 0;
  }
  else {
    literal_enc.block_len_ = (size_t)*literal_enc.block_lengths_;
  }
  literal_enc.entropy_ix_ = 0;
  literal_enc.depths_ = (uint8_t *)0x0;
  literal_enc.bits_ = (uint16_t *)0x0;
  command_enc.block_types_ = (mb->command_split).types;
  command_enc.block_lengths_ = (mb->command_split).lengths;
  command_enc.num_block_types_ = (mb->command_split).num_types;
  command_enc.num_blocks_ = (mb->command_split).num_blocks;
  command_enc.histogram_length_ = 0x2c0;
  command_enc.block_split_code_.type_code_calculator.last_type = 1;
  command_enc.block_split_code_.type_code_calculator.second_last_type = 0;
  command_enc.block_ix_ = 0;
  if (command_enc.num_blocks_ == 0) {
    command_enc.block_len_ = 0;
  }
  else {
    command_enc.block_len_ = (size_t)*command_enc.block_lengths_;
  }
  command_enc.bits_ = (uint16_t *)0x0;
  command_enc.entropy_ix_ = 0;
  command_enc.depths_ = (uint8_t *)0x0;
  distance_enc.block_types_ = (mb->distance_split).types;
  distance_enc.block_lengths_ = (mb->distance_split).lengths;
  distance_enc.num_block_types_ = (mb->distance_split).num_types;
  distance_enc.num_blocks_ = (mb->distance_split).num_blocks;
  distance_enc.block_split_code_.type_code_calculator.last_type = 1;
  distance_enc.block_split_code_.type_code_calculator.second_last_type = 0;
  distance_enc.block_ix_ = 0;
  if (distance_enc.num_blocks_ == 0) {
    distance_enc.block_len_ = 0;
  }
  else {
    distance_enc.block_len_ = (size_t)*distance_enc.block_lengths_;
  }
  distance_enc.entropy_ix_ = 0;
  distance_enc.depths_ = (uint8_t *)0x0;
  distance_enc.bits_ = (uint16_t *)0x0;
  distance_enc.histogram_length_ = (ulong)uVar16;
  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&distance_enc,tree,storage_ix,storage);
  uVar16 = (params->dist).distance_postfix_bits;
  uVar14 = *storage_ix;
  *(ulong *)(storage + (uVar14 >> 3)) =
       (ulong)uVar16 << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
  uVar11 = uVar14 + 2;
  *storage_ix = uVar11;
  *(ulong *)(storage + (uVar11 >> 3)) =
       (ulong)((params->dist).num_direct_distance_codes >> ((byte)uVar16 & 0x1f)) <<
       ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
  uVar14 = uVar14 + 6;
  *storage_ix = uVar14;
  for (uVar11 = 0; uVar11 < (mb->literal_split).num_types; uVar11 = uVar11 + 1) {
    *(ulong *)(storage + (uVar14 >> 3)) =
         (ulong)literal_context_mode << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
    uVar14 = uVar14 + 2;
    *storage_ix = uVar14;
  }
  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,6,tree,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,mb->literal_context_map,mb->literal_context_map_size,
                     mb->literal_histograms_size,tree,storage_ix,storage);
  }
  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,2,tree,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,mb->distance_context_map,mb->distance_context_map_size,
                     mb->distance_histograms_size,tree,storage_ix,storage);
  }
  histogram = mb->literal_histograms;
  sVar8 = mb->literal_histograms_size;
  sVar12 = literal_enc.histogram_length_ * sVar8;
  if (sVar12 == 0) {
    literal_enc.depths_ = (uint8_t *)0x0;
    literal_enc.bits_ = (uint16_t *)0x0;
  }
  else {
    literal_enc.depths_ = (uint8_t *)BrotliAllocate(m,sVar12);
    literal_enc.bits_ = (uint16_t *)BrotliAllocate(m,sVar12 * 2);
  }
  for (sVar12 = 0; sVar8 != sVar12; sVar12 = sVar12 + 1) {
    BuildAndStoreHuffmanTree
              (histogram->data_,literal_enc.histogram_length_,0x100,tree,
               literal_enc.depths_ + literal_enc.histogram_length_ * sVar12,
               literal_enc.bits_ + literal_enc.histogram_length_ * sVar12,storage_ix,storage);
    histogram = histogram + 1;
  }
  histogram_00 = mb->command_histograms;
  sVar8 = mb->command_histograms_size;
  sVar12 = command_enc.histogram_length_ * sVar8;
  if (sVar12 == 0) {
    command_enc.depths_ = (uint8_t *)0x0;
    command_enc.bits_ = (uint16_t *)0x0;
  }
  else {
    command_enc.depths_ = (uint8_t *)BrotliAllocate(m,sVar12);
    command_enc.bits_ = (uint16_t *)BrotliAllocate(m,sVar12 * 2);
  }
  for (sVar12 = 0; sVar8 != sVar12; sVar12 = sVar12 + 1) {
    BuildAndStoreHuffmanTree
              (histogram_00->data_,command_enc.histogram_length_,0x2c0,tree,
               command_enc.depths_ + command_enc.histogram_length_ * sVar12,
               command_enc.bits_ + command_enc.histogram_length_ * sVar12,storage_ix,storage);
    histogram_00 = histogram_00 + 1;
  }
  histogram_01 = mb->distance_histograms;
  sVar8 = mb->distance_histograms_size;
  sVar12 = distance_enc.histogram_length_ * sVar8;
  if (sVar12 == 0) {
    distance_enc.depths_ = (uint8_t *)0x0;
    distance_enc.bits_ = (uint16_t *)0x0;
  }
  else {
    distance_enc.depths_ = (uint8_t *)BrotliAllocate(m,sVar12);
    distance_enc.bits_ = (uint16_t *)BrotliAllocate(m,sVar12 * 2);
  }
  for (sVar12 = 0; sVar8 != sVar12; sVar12 = sVar12 + 1) {
    BuildAndStoreHuffmanTree
              (histogram_01->data_,distance_enc.histogram_length_,(ulong)uVar7,tree,
               distance_enc.depths_ + distance_enc.histogram_length_ * sVar12,
               distance_enc.bits_ + distance_enc.histogram_length_ * sVar12,storage_ix,storage);
    histogram_01 = histogram_01 + 1;
  }
  BrotliFree(m,tree);
  for (sVar8 = 0; sVar8 != n_commands; sVar8 = sVar8 + 1) {
    uVar7 = commands[sVar8].insert_len_;
    uVar11 = (ulong)uVar7;
    uVar16 = commands[sVar8].copy_len_;
    uVar4 = commands[sVar8].dist_extra_;
    uVar2 = commands[sVar8].cmd_prefix_;
    uVar3 = commands[sVar8].dist_prefix_;
    StoreSymbol(&command_enc,(ulong)uVar2,storage_ix,storage);
    uVar13 = uVar7;
    if (5 < uVar11) {
      if (uVar7 < 0x82) {
        uVar13 = 0x1f;
        uVar10 = (uint)(uVar11 - 2);
        if (uVar10 != 0) {
          for (; uVar10 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        iVar9 = (uVar13 ^ 0xffffffe0) + 0x1f;
        uVar13 = (int)(uVar11 - 2 >> ((byte)iVar9 & 0x3f)) + iVar9 * 2 + 2;
      }
      else if (uVar7 < 0x842) {
        uVar13 = 0x1f;
        if (uVar7 - 0x42 != 0) {
          for (; uVar7 - 0x42 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = (uVar13 ^ 0xffffffe0) + 0x2a;
      }
      else {
        uVar13 = 0x15;
        if (0x1841 < uVar7) {
          uVar13 = 0x17 - (uVar7 < 0x5842);
        }
      }
    }
    bVar1 = (byte)(uVar16 >> 0x18);
    uVar16 = uVar16 & 0x1ffffff;
    uVar10 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + uVar16;
    if (uVar10 < 10) {
      uVar17 = uVar10 + 0xfffe;
    }
    else if (uVar10 < 0x86) {
      uVar17 = 0x1f;
      uVar6 = (uint)((ulong)uVar10 - 6);
      if (uVar6 != 0) {
        for (; uVar6 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      iVar9 = (uVar17 ^ 0xffffffe0) + 0x1f;
      uVar17 = (int)((ulong)uVar10 - 6 >> ((byte)iVar9 & 0x3f)) + iVar9 * 2 + 4;
    }
    else {
      uVar17 = 0x17;
      if (uVar10 < 0x846) {
        uVar17 = 0x1f;
        if (uVar10 - 0x46 != 0) {
          for (; uVar10 - 0x46 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        uVar17 = (uVar17 ^ 0xffffffe0) + 0x2c;
      }
    }
    uVar15 = (ulong)((uVar13 & 0xffff) << 2);
    iVar9 = *(int *)((long)kInsExtra + uVar15);
    uVar18 = (ulong)((uVar17 & 0xffff) << 2);
    iVar5 = *(int *)((long)kCopyExtra + uVar18);
    uVar14 = *storage_ix;
    *(ulong *)(storage + (uVar14 >> 3)) =
         ((ulong)(uVar10 - *(int *)((long)kCopyBase + uVar18)) << ((byte)iVar9 & 0x3f) |
         (ulong)(uVar7 - *(int *)((long)kInsBase + uVar15))) << ((byte)uVar14 & 7) |
         (ulong)storage[uVar14 >> 3];
    *storage_ix = (uint)(iVar9 + iVar5) + uVar14;
    if (mb->literal_context_map_size == 0) {
      while (bVar19 = uVar11 != 0, uVar11 = uVar11 - 1, bVar19) {
        StoreSymbol(&literal_enc,(ulong)input[start_pos & mask],storage_ix,storage);
        start_pos = start_pos + 1;
      }
    }
    else {
      while (bVar19 = uVar11 != 0, uVar11 = uVar11 - 1, bVar19) {
        bVar1 = input[start_pos & mask];
        StoreSymbolWithContext
                  (&literal_enc,(ulong)bVar1,
                   (ulong)(""[(ulong)prev_byte2 + (ulong)(literal_context_mode << 9) + 0x100] |
                          ""[(ulong)prev_byte + (ulong)(literal_context_mode << 9)]),
                   mb->literal_context_map,storage_ix,storage,6);
        start_pos = start_pos + 1;
        prev_byte2 = prev_byte;
        prev_byte = bVar1;
      }
    }
    start_pos = start_pos + uVar16;
    if (uVar16 != 0) {
      prev_byte2 = input[start_pos - 2 & mask];
      prev_byte = input[start_pos - 1 & mask];
      if (0x7f < uVar2) {
        uVar11 = (ulong)(uVar3 & 0x3ff);
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(&distance_enc,uVar11,storage_ix,storage);
        }
        else {
          sVar12 = (size_t)(uVar2 & 7);
          if (2 < (uVar2 & 7)) {
            sVar12 = 3;
          }
          context = 3;
          if (((uVar2 >> 6) - 2 & 0xfffffffd) == 0) {
            context = sVar12;
          }
          if (uVar2 >> 6 == 7) {
            context = sVar12;
          }
          StoreSymbolWithContext
                    (&distance_enc,uVar11,context,mb->distance_context_map,storage_ix,storage,2);
        }
        uVar11 = *storage_ix;
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)uVar4 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        *storage_ix = (uVar3 >> 10) + uVar11;
      }
    }
  }
  CleanupBlockEncoder(m,&distance_enc);
  CleanupBlockEncoder(m,&command_enc);
  CleanupBlockEncoder(m,&literal_enc);
  if (is_last != 0) {
    uVar7 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar7 & 0xfffffff8);
    storage[uVar7 >> 3] = '\0';
  }
  return;
}

Assistant:

void BrotliStoreMetaBlock(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    uint8_t prev_byte, uint8_t prev_byte2, BROTLI_BOOL is_last,
    const BrotliEncoderParams* params, ContextType literal_context_mode,
    const Command* commands, size_t n_commands, const MetaBlockSplit* mb,
    size_t* storage_ix, uint8_t* storage) {

  size_t pos = start_pos;
  size_t i;
  uint32_t num_distance_symbols = params->dist.alphabet_size;
  uint32_t num_effective_distance_symbols = num_distance_symbols;
  HuffmanTree* tree;
  ContextLut literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;
  const BrotliDistanceParams* dist = &params->dist;
  if (params->large_window &&
      num_effective_distance_symbols > BROTLI_NUM_HISTOGRAM_DISTANCE_SYMBOLS) {
    num_effective_distance_symbols = BROTLI_NUM_HISTOGRAM_DISTANCE_SYMBOLS;
  }

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  InitBlockEncoder(&literal_enc, BROTLI_NUM_LITERAL_SYMBOLS,
      mb->literal_split.num_types, mb->literal_split.types,
      mb->literal_split.lengths, mb->literal_split.num_blocks);
  InitBlockEncoder(&command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(&distance_enc, num_effective_distance_symbols,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(
      &distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, dist->distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(
      4, dist->num_direct_distance_codes >> dist->distance_postfix_bits,
      storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, &literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, BROTLI_NUM_LITERAL_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, &command_enc, mb->command_histograms,
      mb->command_histograms_size, BROTLI_NUM_COMMAND_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, &distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, num_distance_symbols, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(&command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(&literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context =
            BROTLI_CONTEXT(prev_byte, prev_byte2, literal_context_lut);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(&literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_ & 0x3FF;
        uint32_t distnumextra = cmd.dist_prefix_ >> 10;
        uint64_t distextra = cmd.dist_extra_;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(&distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(&distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, &distance_enc);
  CleanupBlockEncoder(m, &command_enc);
  CleanupBlockEncoder(m, &literal_enc);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}